

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

int run_normal_process(ThreadedReplayer *replayer,
                      vector<const_char_*,_std::allocator<const_char_*>_> *databases,char *whitelist
                      ,uint32_t whitelist_mask,intptr_t metadata_handle)

{
  Hash *__args;
  ResourceTag RVar1;
  uint uVar2;
  char *pcVar3;
  uint *puVar4;
  pointer puVar5;
  DatabaseInterface *pDVar6;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  size_type sVar10;
  size_type sVar11;
  __int_type_conflict1 _Var12;
  pointer pEVar13;
  FILE *__stream;
  pointer pEVar14;
  bool bVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ScratchAllocator *pSVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  size_t __n;
  uint uVar24;
  __hashtable *__this;
  DatabaseInterface *this;
  iterator __position;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  const_iterator __cbeg;
  char **ppcVar25;
  ThreadedReplayer *pTVar26;
  const_iterator __begin2;
  pointer puVar27;
  uint *puVar28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  size_t sVar29;
  uint uVar30;
  __normal_iterator<EnqueuedWork_*,_std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>_> __i;
  long lVar31;
  ulong uVar32;
  pointer pEVar33;
  pointer pEVar34;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var35;
  pointer pEVar36;
  long in_FS_OFFSET;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> graphics_workload;
  size_t resource_hash_count_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> graphics_hashes;
  StateReplayer state_replayer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> raytracing_hashes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> compute_hashes;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> raytracing_workload;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> compute_workload;
  vector<unsigned_char,_std::allocator<unsigned_char>_> state_json;
  vector<unsigned_long,_std::allocator<unsigned_long>_> resource_hashes;
  uint local_1a0;
  uint local_19c;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> local_188;
  ThreadedReplayer *local_168;
  undefined8 local_160;
  char **local_158;
  ulong local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  StateReplayer local_130;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  long local_f0;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> local_e8;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  DatabaseInterface *local_40;
  pointer local_38;
  
  local_48 = std::chrono::_V2::steady_clock::now();
  local_50 = std::chrono::_V2::steady_clock::now();
  create_database((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_40);
  this = local_40;
  if (whitelist == (char *)0x0) {
LAB_001373f7:
    bVar15 = Fossilize::DatabaseInterface::metadata_handle_is_valid(metadata_handle);
    if ((bVar15) &&
       (bVar15 = Fossilize::DatabaseInterface::import_metadata_from_os_handle(this,metadata_handle),
       !bVar15)) {
      run_normal_process();
      goto LAB_001377af;
    }
    lVar17 = std::chrono::_V2::steady_clock::now();
    lVar18 = std::chrono::_V2::steady_clock::now();
    iVar16 = (*this->_vptr_DatabaseInterface[2])(this);
    if ((char)iVar16 == '\0') {
      run_normal_process();
      iVar16 = 1;
      goto LAB_0013782a;
    }
    local_58 = std::chrono::_V2::steady_clock::now();
    Fossilize::StateReplayer::StateReplayer(&local_130);
    Fossilize::StateReplayer::set_resolve_derivative_pipeline_handles(&local_130,false);
    Fossilize::StateReplayer::set_resolve_shader_module_handles(&local_130,false);
    replayer->global_replayer = &local_130;
    replayer->global_database = this;
    bVar15 = ThreadedReplayer::init_implicit_whitelist(replayer);
    if (bVar15) {
      local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar31 = 0;
      local_168 = replayer;
      local_68 = lVar18;
      local_60 = lVar17;
      do {
        pTVar26 = local_168;
        uVar19 = std::chrono::_V2::steady_clock::now();
        local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        RVar1 = *(ResourceTag *)((long)run_normal_process::initial_playback_order + lVar31);
        uVar32 = (ulong)RVar1;
        iVar16 = (*this->_vptr_DatabaseInterface[6])(this,(ulong)RVar1,&local_188,0);
        if ((char)iVar16 == '\0') {
LAB_00137849:
          run_normal_process();
LAB_001377d3:
          iVar16 = 1;
          goto LAB_001377d9;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (&local_88,
                   (size_type)
                   local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl
                   .super__Vector_impl_data._M_start);
        iVar16 = (*this->_vptr_DatabaseInterface[6])
                           (this,(ulong)RVar1,&local_188,
                            local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        puVar5 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((char)iVar16 == '\0') goto LAB_00137849;
        (pTVar26->per_thread_data).
        super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
        ._M_impl.super__Vector_impl_data._M_start[*(uint *)(in_FS_OFFSET + -0x18)].expected_tag =
             RVar1;
        local_160 = uVar19;
        local_f0 = lVar31;
        if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_158 = run_normal_process::tag_names + uVar32;
          puVar27 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (unsigned_long *)0x0;
            (*this->_vptr_DatabaseInterface[3])(this,uVar32,*puVar27,&local_148,0,1);
            iVar16 = (*this->_vptr_DatabaseInterface[3])(this,uVar32,*puVar27,&local_148,0,0);
            if ((char)iVar16 == '\0') {
LAB_001377c4:
              run_normal_process();
              goto LAB_001377d3;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_a8,
                       (size_type)
                       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start);
            iVar16 = (*this->_vptr_DatabaseInterface[3])
                               (this,uVar32,*puVar27,&local_148,
                                local_a8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,0);
            if ((char)iVar16 == '\0') goto LAB_001377c4;
            bVar15 = Fossilize::StateReplayer::parse
                               (&local_130,&local_168->super_StateCreatorInterface,this,
                                local_a8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_a8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_a8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
            if (!bVar15) {
              run_normal_process();
            }
            puVar27 = puVar27 + 1;
          } while (puVar27 != puVar5);
        }
        if (RVar1 == RESOURCE_APPLICATION_INFO) {
          (*(local_168->super_StateCreatorInterface)._vptr_StateCreatorInterface[2])
                    (local_168,0,0,0);
        }
        pcVar3 = run_normal_process::tag_names[uVar32];
        fprintf(_stderr,"Fossilize INFO: Total binary size for %s: %lu (%lu compressed)\n",pcVar3);
        fflush(_stderr);
        lVar17 = std::chrono::_V2::steady_clock::now();
        fprintf(_stderr,"Fossilize INFO: Total time decoding %s in main thread: %.3f s\n",
                (double)(long)(lVar17 - local_160) * 1e-09,pcVar3);
        fflush(_stderr);
        pTVar26 = local_168;
        lVar31 = local_f0 + 4;
      } while (lVar31 != 0x10);
      if (-1 < crash_fd) {
        write_all(crash_fd,"HEARTBEAT\n");
      }
      ThreadedReplayer::start_worker_threads(pTVar26);
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (unsigned_long *)0x0;
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
      local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (unsigned_long *)0x0;
      local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
      local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (unsigned_long *)0x0;
      local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
      if ((pTVar26->opts).pipeline_hash == 0) {
        local_70 = pTVar26->cached_blobs;
        local_1a0 = 0;
        local_19c = 0;
        local_160 = local_160 & 0xffffffff00000000;
        lVar17 = 0;
        do {
          local_150 = 0;
          uVar24 = *(uint *)((long)parse_json_stats(std::__cxx11::string_const&,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>&)
                                   ::stat_tags + lVar17);
          uVar19 = (ulong)uVar24;
          iVar16 = (*this->_vptr_DatabaseInterface[6])(this,(ulong)uVar24,&local_150,0);
          if ((char)iVar16 == '\0') {
LAB_00138631:
            run_normal_process();
            goto LAB_0013863b;
          }
          uVar30 = (uint)local_150;
          if (uVar19 == 9) {
            uVar24 = (pTVar26->opts).start_raytracing_index;
            uVar2 = (pTVar26->opts).end_raytracing_index;
            uVar32 = (ulong)uVar2;
            if (uVar30 <= uVar2) {
              uVar32 = local_150 & 0xffffffff;
            }
            if ((uint)uVar32 <= uVar24) {
              uVar24 = (uint)uVar32;
            }
            this_01 = &local_128;
            local_160 = CONCAT44(local_160._4_4_,uVar24);
          }
          else {
            this_01 = &local_148;
            if (uVar24 == 7) {
              local_19c = (pTVar26->opts).start_compute_index;
              uVar24 = (pTVar26->opts).end_compute_index;
              uVar32 = (ulong)uVar24;
              if (uVar30 <= uVar24) {
                uVar32 = local_150 & 0xffffffff;
              }
              if ((uint)uVar32 <= local_19c) {
                local_19c = (uint)uVar32;
              }
              this_01 = &local_108;
              uVar24 = local_19c;
            }
            else {
              if (uVar24 != 6) {
                __assert_fail("hashes",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp"
                              ,0xf3e,
                              "int run_normal_process(ThreadedReplayer &, const vector<const char *> &, const char *, uint32_t, intptr_t)"
                             );
              }
              uVar24 = (pTVar26->opts).start_graphics_index;
              uVar2 = (pTVar26->opts).end_graphics_index;
              uVar32 = (ulong)uVar2;
              if (uVar30 <= uVar2) {
                uVar32 = local_150 & 0xffffffff;
              }
              uVar30 = (uint)uVar32;
              local_1a0 = uVar24;
              if (uVar30 <= uVar24) {
                uVar24 = uVar30;
                local_1a0 = uVar30;
              }
            }
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_01,local_150);
          iVar16 = (*this->_vptr_DatabaseInterface[6])
                             (this,uVar19,&local_150,
                              (this_01->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start);
          if ((char)iVar16 == '\0') goto LAB_00138631;
          __n = uVar32 * 8 + (ulong)uVar24 * -8;
          local_f0 = lVar17;
          if (__n != 0) {
            puVar5 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            memmove(puVar5,puVar5 + uVar24,__n);
          }
          ppcVar25 = (char **)(this_01->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start;
          local_158 = ppcVar25 + ((int)uVar32 - uVar24);
          if (local_158 !=
              (char **)(this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish) {
            (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_158;
          }
          pDVar6 = (pTVar26->replayer_cache_db)._M_t.
                   super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                   .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
          if (pDVar6 != (DatabaseInterface *)0x0) {
            local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            iVar16 = (*pDVar6->_vptr_DatabaseInterface[6])(pDVar6,uVar19,&local_e8,0);
            if (((char)iVar16 != '\0') &&
               (local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0)) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188,
                         (size_type)
                         local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                         _M_impl.super__Vector_impl_data._M_start);
              iVar16 = (*pDVar6->_vptr_DatabaseInterface[6])
                                 (pDVar6,uVar19,&local_e8,
                                  local_188.
                                  super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              if ((char)iVar16 != '\0') {
                p_Var35 = &local_70[uVar19]._M_h;
                auVar38._0_8_ =
                     (double)CONCAT44(0x43300000,
                                      (int)local_e8.
                                           super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
                auVar38._8_4_ =
                     (int)((ulong)local_e8.
                                  super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 0x20);
                auVar38._12_4_ = 0x45300000;
                dVar37 = ceil(((auVar38._8_8_ - 1.9342813113834067e+25) +
                              (auVar38._0_8_ - 4503599627370496.0)) /
                              (double)(p_Var35->_M_rehash_policy)._M_max_load_factor);
                std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::rehash(p_Var35,(long)(dVar37 - 9.223372036854776e+18) & (long)dVar37 >> 0x3f |
                                 (long)dVar37);
                pEVar13 = local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                for (pEVar33 = local_188.
                               super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                               _M_impl.super__Vector_impl_data._M_start; pEVar33 != pEVar13;
                    pEVar33 = (pointer)&pEVar33->func) {
                  local_38 = *(pointer *)pEVar33;
                  local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)p_Var35;
                  std::
                  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                            ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)p_Var35,&local_38,&local_c8);
                }
              }
            }
            if (local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_188.
                              super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_188.
                                    super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_188.
                                    super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            ppcVar25 = (char **)(this_01->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start;
            local_158 = (char **)(this_01->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_finish;
          }
          if (ppcVar25 != local_158) {
            do {
              local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (*this->_vptr_DatabaseInterface[3])(this,uVar19,*ppcVar25,&local_188,0,1);
              iVar16 = (*this->_vptr_DatabaseInterface[3])(this,uVar19,*ppcVar25,&local_188,0,0);
              if ((char)iVar16 == '\0') {
                run_normal_process();
                goto LAB_0013863b;
              }
              ppcVar25 = ppcVar25 + 1;
            } while (ppcVar25 != local_158);
          }
          fprintf(_stderr,"Fossilize INFO: Total binary size for %s: %lu (%lu compressed)\n",
                  run_normal_process::tag_names[uVar19]);
          fflush(_stderr);
          lVar17 = local_f0 + 4;
          pTVar26 = local_168;
        } while (lVar17 != 0xc);
LAB_00137e03:
        pTVar26 = local_168;
        pSVar20 = Fossilize::StateReplayer::get_allocator(&local_130);
        Fossilize::ScratchAllocator::reset(pSVar20);
        local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>
                  (pTVar26,pTVar26->deferred_graphics,&pTVar26->graphics_pipelines,
                   &pTVar26->graphics_parents,&local_188,&local_148,local_1a0);
        ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredComputeInfo>
                  (pTVar26,pTVar26->deferred_compute,&pTVar26->compute_pipelines,
                   &pTVar26->compute_parents,&local_c8,&local_108,local_19c);
        ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredRayTracingInfo>
                  (pTVar26,pTVar26->deferred_raytracing,&pTVar26->raytracing_pipelines,
                   &pTVar26->raytracing_parents,&local_e8,&local_128,(uint)local_160);
        pEVar13 = local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pEVar33 = local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          lVar18 = (long)local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          uVar19 = (lVar18 >> 3) * -0x3333333333333333;
          lVar17 = 0x3f;
          if (uVar19 != 0) {
            for (; uVar19 >> lVar17 == 0; lVar17 = lVar17 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__0>>
                    (local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                     _M_impl.super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar18 < 0x281) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__0>>
                      (pEVar33,pEVar13);
          }
          else {
            pEVar34 = pEVar33 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__0>>
                      (pEVar33,pEVar34);
            for (; pEVar34 != pEVar13; pEVar34 = pEVar34 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Val_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__0>>
                        (pEVar34);
            }
          }
        }
        pEVar13 = local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pEVar33 = local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          lVar18 = (long)local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          uVar19 = (lVar18 >> 3) * -0x3333333333333333;
          lVar17 = 0x3f;
          if (uVar19 != 0) {
            for (; uVar19 >> lVar17 == 0; lVar17 = lVar17 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__1>>
                    (local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                     _M_impl.super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar18 < 0x281) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__1>>
                      (pEVar33,pEVar13);
          }
          else {
            p_Var35 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)((long)pEVar33 + 0x268))->_M_element_count;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__1>>
                      (pEVar33,p_Var35);
            for (; p_Var35 !=
                   (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)pEVar13;
                p_Var35 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&(p_Var35->_M_rehash_policy)._M_next_resize) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Val_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__1>>
                        (p_Var35);
            }
          }
        }
        pEVar14 = local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pEVar34 = local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pEVar33 = local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pEVar13 = local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          lVar18 = (long)local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          uVar19 = (lVar18 >> 3) * -0x3333333333333333;
          lVar17 = 0x3f;
          if (uVar19 != 0) {
            for (; uVar19 >> lVar17 == 0; lVar17 = lVar17 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__2>>
                    (local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                     _M_impl.super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar18 < 0x281) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__2>>
                      (pEVar34,pEVar14);
            pEVar33 = local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pEVar13 = local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            pEVar36 = pEVar34 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__2>>
                      (pEVar34,pEVar36);
            for (; pEVar33 = local_188.
                             super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl
                             .super__Vector_impl_data._M_start,
                pEVar13 = local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                          _M_impl.super__Vector_impl_data._M_finish, pEVar36 != pEVar14;
                pEVar36 = pEVar36 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Val_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__2>>
                        (pEVar36);
            }
          }
        }
        for (; pEVar34 = local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                         _M_impl.super__Vector_impl_data._M_finish,
            pEVar33 !=
            local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
            super__Vector_impl_data._M_finish; pEVar33 = pEVar33 + 1) {
          local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
          super__Vector_impl_data._M_finish = pEVar13;
          if ((pEVar33->func).super__Function_base._M_manager == (_Manager_type)0x0)
          goto LAB_0013869b;
          (*(pEVar33->func)._M_invoker)((_Any_data *)&pEVar33->func);
          if (-1 < crash_fd) {
            write_all(crash_fd,"HEARTBEAT\n");
          }
          pEVar13 = local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
          super__Vector_impl_data._M_finish = pEVar34;
        }
        local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_finish = pEVar13;
        ThreadedReplayer::sync_worker_threads(pTVar26);
        pEVar33 = local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (p_Var35 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)local_c8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            p_Var35 !=
            (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)pEVar33;
            p_Var35 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&(p_Var35->_M_rehash_policy)._M_next_resize) {
          if (p_Var35->_M_element_count == 0) goto LAB_0013869b;
          (**(code **)&p_Var35->_M_rehash_policy)(&p_Var35->_M_bucket_count);
          if (-1 < crash_fd) {
            write_all(crash_fd,"HEARTBEAT\n");
          }
        }
        ThreadedReplayer::sync_worker_threads(pTVar26);
        pEVar13 = local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (pEVar33 = local_e8.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                       _M_impl.super__Vector_impl_data._M_start; pEVar33 != pEVar13;
            pEVar33 = pEVar33 + 1) {
          if ((pEVar33->func).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0013869b:
            std::__throw_bad_function_call();
          }
          (*(pEVar33->func)._M_invoker)((_Any_data *)&pEVar33->func);
          if (-1 < crash_fd) {
            write_all(crash_fd,"HEARTBEAT\n");
          }
        }
        ThreadedReplayer::sync_worker_threads(pTVar26);
        ThreadedReplayer::tear_down_threads(pTVar26);
        iVar16 = 0;
        fprintf(_stderr,"Fossilize INFO: Total binary size for %s: %lu (%lu compressed)\n",
                "Shader Module",
                (pTVar26->shader_module_total_size).super___atomic_base<unsigned_long>._M_i,
                (pTVar26->shader_module_total_compressed_size).super___atomic_base<unsigned_long>.
                _M_i);
        fflush(_stderr);
        sVar21 = pTVar26->compute_pipelines_cleared +
                 (pTVar26->compute_pipelines)._M_h._M_element_count;
        pTVar26->compute_pipelines_cleared = sVar21;
        sVar29 = pTVar26->graphics_pipelines_cleared +
                 (pTVar26->graphics_pipelines)._M_h._M_element_count;
        pTVar26->graphics_pipelines_cleared = sVar29;
        sVar23 = pTVar26->raytracing_pipelines_cleared +
                 (pTVar26->raytracing_pipelines)._M_h._M_element_count;
        pTVar26->raytracing_pipelines_cleared = sVar23;
        sVar7 = (pTVar26->samplers)._M_h._M_element_count;
        sVar8 = (pTVar26->layouts)._M_h._M_element_count;
        sVar9 = (pTVar26->pipeline_layouts)._M_h._M_element_count;
        sVar10 = (pTVar26->shader_modules).hash_to_objects._M_h._M_element_count;
        sVar11 = (pTVar26->render_passes)._M_h._M_element_count;
        lVar17 = local_58 - local_68;
        lVar18 = local_60 - local_50;
        lVar31 = std::chrono::_V2::steady_clock::now();
        pTVar26 = local_168;
        lVar31 = lVar31 - local_48;
        fprintf(_stderr,"Fossilize INFO: Opening archive took %ld ms:\n",lVar18 / 1000000);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO: Parsing archive took %ld ms:\n",lVar17 / 1000000);
        fflush(_stderr);
        if (((pTVar26->opts).on_disk_pipeline_cache_path._M_string_length != 0) &&
           (((pTVar26->device)._M_t.
             super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
             .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
            supports_pipeline_feedback == true)) {
          run_normal_process();
        }
        _Var12 = (pTVar26->shader_module_ns).super___atomic_base<unsigned_long>._M_i;
        auVar39._8_4_ = (int)(_Var12 >> 0x20);
        auVar39._0_8_ = _Var12;
        auVar39._12_4_ = 0x45300000;
        fprintf(_stderr,
                "Fossilize INFO: Playing back %u shader modules took %.3f s (accumulated time)\n",
                ((auVar39._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)_Var12) - 4503599627370496.0)) * 1e-09,
                (ulong)(pTVar26->shader_module_count).super___atomic_base<unsigned_int>._M_i);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO: Shader cache evicted %u shader modules in total\n",
                (ulong)(pTVar26->shader_module_evicted_count).super___atomic_base<unsigned_int>._M_i
               );
        fflush(_stderr);
        _Var12 = (pTVar26->graphics_pipeline_ns).super___atomic_base<unsigned_long>._M_i;
        auVar40._8_4_ = (int)(_Var12 >> 0x20);
        auVar40._0_8_ = _Var12;
        auVar40._12_4_ = 0x45300000;
        fprintf(_stderr,
                "Fossilize INFO: Playing back %u graphics pipelines took %.3f s (accumulated time)\n"
                ,((auVar40._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)_Var12) - 4503599627370496.0)) * 1e-09,
                (ulong)(pTVar26->graphics_pipeline_count).super___atomic_base<unsigned_int>._M_i);
        fflush(_stderr);
        _Var12 = (pTVar26->compute_pipeline_ns).super___atomic_base<unsigned_long>._M_i;
        auVar41._8_4_ = (int)(_Var12 >> 0x20);
        auVar41._0_8_ = _Var12;
        auVar41._12_4_ = 0x45300000;
        fprintf(_stderr,
                "Fossilize INFO: Playing back %u compute pipelines took %.3f s (accumulated time)\n"
                ,((auVar41._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)_Var12) - 4503599627370496.0)) * 1e-09,
                (ulong)(pTVar26->compute_pipeline_count).super___atomic_base<unsigned_int>._M_i);
        fflush(_stderr);
        _Var12 = (pTVar26->raytracing_pipeline_ns).super___atomic_base<unsigned_long>._M_i;
        auVar42._8_4_ = (int)(_Var12 >> 0x20);
        auVar42._0_8_ = _Var12;
        auVar42._12_4_ = 0x45300000;
        fprintf(_stderr,
                "Fossilize INFO: Playing back %u raytracing pipelines took %.3f s (accumulated time)\n"
                ,((auVar42._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)_Var12) - 4503599627370496.0)) * 1e-09,
                (ulong)(pTVar26->raytracing_pipeline_count).super___atomic_base<unsigned_int>._M_i);
        fflush(_stderr);
        _Var12 = (pTVar26->total_idle_ns).super___atomic_base<unsigned_long>._M_i;
        auVar43._8_4_ = (int)(_Var12 >> 0x20);
        auVar43._0_8_ = _Var12;
        auVar43._12_4_ = 0x45300000;
        fprintf(_stderr,
                "Fossilize INFO: Threads were idling in total for %.3f s (accumulated time)\n",
                ((auVar43._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)_Var12) - 4503599627370496.0)) * 1e-09);
        fflush(_stderr);
        _Var12 = (pTVar26->thread_total_ns).super___atomic_base<unsigned_long>._M_i;
        auVar44._8_4_ = (int)(_Var12 >> 0x20);
        auVar44._0_8_ = _Var12;
        auVar44._12_4_ = 0x45300000;
        fprintf(_stderr,
                "Fossilize INFO: Threads were active in total for %.3f s (accumulated time)\n",
                ((auVar44._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)_Var12) - 4503599627370496.0)) * 1e-09);
        fflush(_stderr);
        __stream = _stderr;
        _Var12 = (pTVar26->total_peak_memory).super___atomic_base<unsigned_long>._M_i;
        pSVar20 = Fossilize::StateReplayer::get_allocator(&local_130);
        sVar22 = Fossilize::ScratchAllocator::get_peak_memory_consumption(pSVar20);
        lVar17 = sVar22 + _Var12;
        auVar45._8_4_ = (int)((ulong)lVar17 >> 0x20);
        auVar45._0_8_ = lVar17;
        auVar45._12_4_ = 0x45300000;
        fprintf(__stream,"Fossilize INFO: Total peak memory consumption by parser: %.3f MB.\n",
                ((auVar45._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) * 1e-06);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO: Replayed %lu objects in %ld ms:\n",
                sVar29 + sVar21 + sVar23 + sVar7 + sVar8 + sVar9 + sVar10 + sVar11,lVar31 / 1000000)
        ;
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO:   samplers:              %7lu\n",
                (pTVar26->samplers)._M_h._M_element_count);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO:   descriptor set layouts:%7lu\n",
                (pTVar26->layouts)._M_h._M_element_count);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO:   pipeline layouts:      %7lu\n",
                (pTVar26->pipeline_layouts)._M_h._M_element_count);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO:   render passes:         %7lu\n",
                (pTVar26->render_passes)._M_h._M_element_count);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO:   compute pipelines:     %7lu\n",
                pTVar26->compute_pipelines_cleared);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO:   graphics pipelines:    %7lu\n",
                pTVar26->graphics_pipelines_cleared);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO:   raytracing pipelines:  %7lu\n",
                pTVar26->raytracing_pipelines_cleared);
        fflush(_stderr);
        std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::~vector(&local_e8);
        std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::~vector(&local_c8);
        std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::~vector(&local_188);
      }
      else {
        __args = &(pTVar26->opts).pipeline_hash;
        lVar17 = 0;
        do {
          local_188.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          uVar24 = *(uint *)((long)parse_json_stats(std::__cxx11::string_const&,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>&)
                                   ::stat_tags + lVar17);
          iVar16 = (*this->_vptr_DatabaseInterface[3])(this,(ulong)uVar24,*__args,&local_188,0,0);
          if ((char)iVar16 != '\0') {
            if (uVar24 == 9) {
              if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                __position._M_current =
                     local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_128;
LAB_00137d50:
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>(this_00,__position,__args);
              }
              else {
                *local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish = *__args;
                local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            else if (uVar24 == 7) {
              if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                __position._M_current =
                     local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_108;
                goto LAB_00137d50;
              }
              *local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = *__args;
              local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            else if (uVar24 == 6) {
              __position._M_current =
                   local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_148;
              if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00137d50;
              *local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = *__args;
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0xc);
        if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_160 = (ulong)local_160._4_4_ << 0x20;
          local_19c = 0;
          local_1a0 = 0;
          goto LAB_00137e03;
        }
        local_160 = (ulong)local_160._4_4_ << 0x20;
        if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_19c = 0;
          local_1a0 = 0;
          goto LAB_00137e03;
        }
        local_19c = 0;
        local_1a0 = 0;
        if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00137e03;
        run_normal_process();
LAB_0013863b:
        iVar16 = 1;
      }
      if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
        operator_delete(local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_128.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
        operator_delete(local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_108.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
        operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_148.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
LAB_001377d9:
      if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      this = local_40;
      if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        this = local_40;
      }
    }
    else {
      run_normal_process();
      iVar16 = 1;
    }
    Fossilize::StateReplayer::~StateReplayer(&local_130);
  }
  else {
    Fossilize::DatabaseInterface::set_whitelist_tag_mask(local_40,whitelist_mask);
    bVar15 = Fossilize::DatabaseInterface::load_whitelist_database(this,whitelist);
    if (bVar15) {
      iVar16 = (*this->_vptr_DatabaseInterface[10])(this);
      if ((char)iVar16 != '\0') {
        puVar4 = (replayer->opts).implicit_whitelist_database_indices.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar28 = (replayer->opts).implicit_whitelist_database_indices.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar28 != puVar4; puVar28 = puVar28 + 1) {
          Fossilize::DatabaseInterface::promote_sub_database_to_whitelist(this,*puVar28);
        }
      }
      goto LAB_001373f7;
    }
    run_normal_process();
LAB_001377af:
    iVar16 = 1;
  }
  if (this == (DatabaseInterface *)0x0) {
    return iVar16;
  }
LAB_0013782a:
  (*this->_vptr_DatabaseInterface[1])(this);
  return iVar16;
}

Assistant:

static int run_normal_process(ThreadedReplayer &replayer, const vector<const char *> &databases,
                              const char *whitelist, uint32_t whitelist_mask,
                              intptr_t metadata_handle)
{
	auto start_time = chrono::steady_clock::now();
	auto start_create_archive = chrono::steady_clock::now();
	auto resolver = create_database(databases);

	if (whitelist)
	{
		resolver->set_whitelist_tag_mask(whitelist_mask);
		if (!resolver->load_whitelist_database(whitelist))
		{
			LOGE("Failed to load whitelist database: %s.\n", whitelist);
			return EXIT_FAILURE;
		}

		if (resolver->has_sub_databases())
			for (unsigned index : replayer.opts.implicit_whitelist_database_indices)
				resolver->promote_sub_database_to_whitelist(index);
	}

	if (DatabaseInterface::metadata_handle_is_valid(metadata_handle))
	{
		if (!resolver->import_metadata_from_os_handle(metadata_handle))
		{
			LOGE("Failed to import metadata.\n");
			return EXIT_FAILURE;
		}
	}

	auto end_create_archive = chrono::steady_clock::now();

	auto start_prepare = chrono::steady_clock::now();
	if (!resolver->prepare())
	{
		LOGE("Failed to prepare database.\n");
		return EXIT_FAILURE;
	}
	auto end_prepare = chrono::steady_clock::now();

	StateReplayer state_replayer;
	state_replayer.set_resolve_derivative_pipeline_handles(false);
	state_replayer.set_resolve_shader_module_handles(false);
	replayer.global_replayer = &state_replayer;
	replayer.global_database = resolver.get();

	if (!replayer.init_implicit_whitelist())
	{
		LOGE("Failed to initialize implicit whitelist.\n");
		return EXIT_FAILURE;
	}

	vector<Hash> resource_hashes;
	vector<uint8_t> state_json;

	static const ResourceTag initial_playback_order[] = {
		RESOURCE_APPLICATION_INFO, // This will create the device, etc.
		RESOURCE_DESCRIPTOR_SET_LAYOUT, // Trivial, run in main thread. Dependent immutable samplers are pulled in on-demand.
		RESOURCE_PIPELINE_LAYOUT, // Trivial, run in main thread
		RESOURCE_RENDER_PASS, // Trivial, run in main thread
	};

	static const ResourceTag threaded_playback_order[] = {
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
		RESOURCE_RAYTRACING_PIPELINE,
	};

	static const char *tag_names[] = {
		"AppInfo",
		"Sampler",
		"Descriptor Set Layout",
		"Pipeline Layout",
		"Shader Module",
		"Render Pass",
		"Graphics Pipeline",
		"Compute Pipeline",
		"Info Links",
		"Raytracing Pipeline",
	};

	for (auto &tag : initial_playback_order)
	{
		auto main_thread_start = std::chrono::steady_clock::now();
		size_t tag_total_size = 0;
		size_t tag_total_size_compressed = 0;
		size_t resource_hash_count = 0;

		if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, nullptr))
		{
			LOGE("Failed to get list of resource hashes.\n");
			return EXIT_FAILURE;
		}

		resource_hashes.resize(resource_hash_count);

		if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, resource_hashes.data()))
		{
			LOGE("Failed to get list of resource hashes.\n");
			return EXIT_FAILURE;
		}

		auto &per_thread_data = replayer.get_per_thread_data();
		per_thread_data.expected_tag = tag;

		for (auto &hash : resource_hashes)
		{
			size_t state_json_size = 0;
			if (resolver->read_entry(tag, hash, &state_json_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
			{
				tag_total_size_compressed += state_json_size;
			}			

			if (!resolver->read_entry(tag, hash, &state_json_size, nullptr, 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			state_json.resize(state_json_size);
			tag_total_size += state_json_size;

			if (!resolver->read_entry(tag, hash, &state_json_size, state_json.data(), 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			if (!state_replayer.parse(replayer, resolver.get(), state_json.data(), state_json.size()))
				LOGW("Did not replay blob (tag: %s, hash: %016" PRIx64 "). See previous logs for context.\n", tag_names[tag], hash);
		}

		if (tag == RESOURCE_APPLICATION_INFO)
		{
			// Just in case there was no application info in the database, we provide a dummy info,
			// this makes sure the VkDevice is created.
			replayer.set_application_info(0, nullptr, nullptr);
		}

		LOGI("Total binary size for %s: %" PRIu64 " (%" PRIu64 " compressed)\n", tag_names[tag],
		     uint64_t(tag_total_size),
		     uint64_t(tag_total_size_compressed));

		auto main_thread_end = std::chrono::steady_clock::now();
		auto duration = std::chrono::duration_cast<std::chrono::nanoseconds>(main_thread_end - main_thread_start).count();
		LOGI("Total time decoding %s in main thread: %.3f s\n", tag_names[tag], duration * 1e-9);
	}

	heartbeat();

	// Now we've laid the initial ground work, kick off worker threads.
	replayer.start_worker_threads();

	vector<Hash> graphics_hashes;
	vector<Hash> compute_hashes;
	vector<Hash> raytracing_hashes;
	unsigned graphics_start_index = 0;
	unsigned compute_start_index = 0;
	unsigned raytracing_start_index = 0;

	if (replayer.opts.pipeline_hash != 0)
	{
		for (auto &tag : threaded_playback_order)
		{
			size_t state_json_size = 0;
			if (resolver->read_entry(tag, replayer.opts.pipeline_hash, &state_json_size, nullptr, 0))
			{
				if (tag == RESOURCE_GRAPHICS_PIPELINE)
					graphics_hashes.push_back(replayer.opts.pipeline_hash);
				else if (tag == RESOURCE_COMPUTE_PIPELINE)
					compute_hashes.push_back(replayer.opts.pipeline_hash);
				else if (tag == RESOURCE_RAYTRACING_PIPELINE)
					raytracing_hashes.push_back(replayer.opts.pipeline_hash);
			}
		}

		if (graphics_hashes.empty() && compute_hashes.empty() && raytracing_hashes.empty())
		{
			LOGE("Specified pipeline hash %016" PRIx64 " not found in database.\n",
			     replayer.opts.pipeline_hash);
			return EXIT_FAILURE;
		}
	}
	else
	{
		for (auto &tag : threaded_playback_order)
		{
			size_t tag_total_size = 0;
			size_t tag_total_size_compressed = 0;
			size_t resource_hash_count = 0;

			if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, nullptr))
			{
				LOGE("Failed to get list of resource hashes.\n");
				return EXIT_FAILURE;
			}

			unsigned start_index = 0;
			unsigned end_index = resource_hash_count;

			vector<Hash> *hashes = nullptr;

			if (tag == RESOURCE_GRAPHICS_PIPELINE)
			{
				hashes = &graphics_hashes;

				end_index = min(end_index, replayer.opts.end_graphics_index);
				start_index = max(start_index, replayer.opts.start_graphics_index);
				start_index = min(end_index, start_index);
				graphics_start_index = start_index;

			}
			else if (tag == RESOURCE_COMPUTE_PIPELINE)
			{
				hashes = &compute_hashes;

				end_index = min(end_index, replayer.opts.end_compute_index);
				start_index = max(start_index, replayer.opts.start_compute_index);
				start_index = min(end_index, start_index);
				compute_start_index = start_index;
			}
			else if (tag == RESOURCE_RAYTRACING_PIPELINE)
			{
				hashes = &raytracing_hashes;

				end_index = min(end_index, replayer.opts.end_raytracing_index);
				start_index = max(start_index, replayer.opts.start_raytracing_index);
				start_index = min(end_index, start_index);
				raytracing_start_index = start_index;
			}

			assert(hashes);
			hashes->resize(resource_hash_count);

			if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, hashes->data()))
			{
				LOGE("Failed to get list of resource hashes.\n");
				return EXIT_FAILURE;
			}

			move(begin(*hashes) + start_index, begin(*hashes) + end_index, begin(*hashes));
			hashes->erase(begin(*hashes) + (end_index - start_index), end(*hashes));

			if (replayer.replayer_cache_db)
				populate_blob_hash_set(replayer.cached_blobs[tag], tag, *replayer.replayer_cache_db);

			for (auto &hash : *hashes)
			{
				size_t state_json_size = 0;
				if (resolver->read_entry(tag, hash, &state_json_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
				{
					tag_total_size_compressed += state_json_size;
				}

				if (!resolver->read_entry(tag, hash, &state_json_size, nullptr, 0))
				{
					LOGE("Failed to load blob from cache.\n");
					return EXIT_FAILURE;
				}
				tag_total_size += state_json_size;
			}

			LOGI("Total binary size for %s: %" PRIu64 " (%" PRIu64 " compressed)\n", tag_names[tag],
			     uint64_t(tag_total_size),
			     uint64_t(tag_total_size_compressed));
		}
	}

	// Done parsing static objects.
	state_replayer.get_allocator().reset();

	vector<EnqueuedWork> graphics_workload;
	vector<EnqueuedWork> compute_workload;
	vector<EnqueuedWork> raytracing_workload;
	replayer.enqueue_deferred_pipelines(replayer.deferred_graphics, replayer.graphics_pipelines, replayer.graphics_parents,
	                                    graphics_workload,
	                                    graphics_hashes, graphics_start_index);
	replayer.enqueue_deferred_pipelines(replayer.deferred_compute, replayer.compute_pipelines, replayer.compute_parents,
	                                    compute_workload, compute_hashes,
	                                    compute_start_index);
	replayer.enqueue_deferred_pipelines(replayer.deferred_raytracing, replayer.raytracing_pipelines, replayer.raytracing_parents,
	                                    raytracing_workload, raytracing_hashes,
	                                    raytracing_start_index);

	sort(begin(graphics_workload), end(graphics_workload), [](const EnqueuedWork &a, const EnqueuedWork &b) {
		return a.order_index < b.order_index;
	});
	sort(begin(compute_workload), end(compute_workload), [](const EnqueuedWork &a, const EnqueuedWork &b) {
		return a.order_index < b.order_index;
	});
	sort(begin(raytracing_workload), end(raytracing_workload), [](const EnqueuedWork &a, const EnqueuedWork &b) {
		return a.order_index < b.order_index;
	});

	const auto run_work = [&replayer](const std::vector<EnqueuedWork> &workload) {
		for (auto &work : workload)
		{
			work.func();
			heartbeat();
		}

		// Need to synchronize worker threads between pipeline types to avoid a race condition
		// where memory iteration 1 for a GPL link is running, and then compute starts running
		// with only memory iteration 0 (< 1024 pipelines).
		// Then we get the pattern of:
		// - Link GPL pipeline iteration 1
		// - Sync memory context 0
		// - LRU maintenance memory context 0
		// - Free pipelines (race condition!)
		// To avoid shenanigans, synchronize everything between types.
		replayer.sync_worker_threads();
	};

	run_work(graphics_workload);
	run_work(compute_workload);
	run_work(raytracing_workload);

	replayer.tear_down_threads();

	LOGI("Total binary size for %s: %" PRIu64 " (%" PRIu64 " compressed)\n", tag_names[RESOURCE_SHADER_MODULE],
	     uint64_t(replayer.shader_module_total_size.load()),
	     uint64_t(replayer.shader_module_total_compressed_size.load()));

	replayer.compute_pipelines_cleared += replayer.compute_pipelines.size();
	replayer.graphics_pipelines_cleared += replayer.graphics_pipelines.size();
	replayer.raytracing_pipelines_cleared += replayer.raytracing_pipelines.size();

	unsigned long total_size =
		replayer.samplers.size() +
		replayer.layouts.size() +
		replayer.pipeline_layouts.size() +
		replayer.shader_modules.get_current_object_count() +
		replayer.render_passes.size() +
		replayer.compute_pipelines_cleared +
		replayer.graphics_pipelines_cleared +
		replayer.raytracing_pipelines_cleared;

	long elapsed_ms_prepare = chrono::duration_cast<chrono::milliseconds>(end_prepare - start_prepare).count();
	long elapsed_ms_read_archive = chrono::duration_cast<chrono::milliseconds>(end_create_archive - start_create_archive).count();
	long elapsed_ms = chrono::duration_cast<chrono::milliseconds>(chrono::steady_clock::now() - start_time).count();

	LOGI("Opening archive took %ld ms:\n", elapsed_ms_read_archive);
	LOGI("Parsing archive took %ld ms:\n", elapsed_ms_prepare);

	if (!replayer.opts.on_disk_pipeline_cache_path.empty() && replayer.device->pipeline_feedback_enabled())
	{
		LOGI("Pipeline cache hits reported: %u\n", replayer.pipeline_cache_hits.load());
		LOGI("Pipeline cache misses reported: %u\n", replayer.pipeline_cache_misses.load());
	}

	LOGI("Playing back %u shader modules took %.3f s (accumulated time)\n",
	     replayer.shader_module_count.load(),
	     replayer.shader_module_ns.load() * 1e-9);

	LOGI("Shader cache evicted %u shader modules in total\n",
	     replayer.shader_module_evicted_count.load());

	LOGI("Playing back %u graphics pipelines took %.3f s (accumulated time)\n",
	     replayer.graphics_pipeline_count.load(),
	     replayer.graphics_pipeline_ns.load() * 1e-9);

	LOGI("Playing back %u compute pipelines took %.3f s (accumulated time)\n",
	     replayer.compute_pipeline_count.load(),
	     replayer.compute_pipeline_ns.load() * 1e-9);

	LOGI("Playing back %u raytracing pipelines took %.3f s (accumulated time)\n",
	     replayer.raytracing_pipeline_count.load(),
	     replayer.raytracing_pipeline_ns.load() * 1e-9);

	LOGI("Threads were idling in total for %.3f s (accumulated time)\n",
	     replayer.total_idle_ns.load() * 1e-9);

	LOGI("Threads were active in total for %.3f s (accumulated time)\n",
	     replayer.thread_total_ns.load() * 1e-9);

	LOGI("Total peak memory consumption by parser: %.3f MB.\n",
	     (replayer.total_peak_memory.load() + state_replayer.get_allocator().get_peak_memory_consumption()) * 1e-6);

	LOGI("Replayed %lu objects in %ld ms:\n", total_size, elapsed_ms);
	LOGI("  samplers:              %7lu\n", (unsigned long)replayer.samplers.size());
	LOGI("  descriptor set layouts:%7lu\n", (unsigned long)replayer.layouts.size());
	LOGI("  pipeline layouts:      %7lu\n", (unsigned long)replayer.pipeline_layouts.size());
	LOGI("  render passes:         %7lu\n", (unsigned long)replayer.render_passes.size());
	LOGI("  compute pipelines:     %7lu\n", (unsigned long)replayer.compute_pipelines_cleared);
	LOGI("  graphics pipelines:    %7lu\n", (unsigned long)replayer.graphics_pipelines_cleared);
	LOGI("  raytracing pipelines:  %7lu\n", (unsigned long)replayer.raytracing_pipelines_cleared);

	return EXIT_SUCCESS;
}